

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

UInt32 crnlib::Hc4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  byte *cur;
  CLzRef *pCVar3;
  bool bVar4;
  uint uVar5;
  UInt32 UVar6;
  UInt32 *pUVar7;
  uint uVar8;
  uint uVar9;
  UInt32 UVar10;
  ulong uVar11;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar5 = (uint)cur[1] ^ p->crc[*cur];
  uVar8 = (uint)cur[2] << 8 ^ uVar5;
  uVar5 = uVar5 & 0x3ff;
  uVar11 = (ulong)(uVar8 & 0xffff);
  UVar10 = p->pos;
  pCVar3 = p->hash;
  CVar1 = pCVar3[uVar5];
  uVar9 = UVar10 - CVar1;
  CVar2 = pCVar3[uVar11 + 0x400];
  uVar8 = ((p->crc[cur[3]] << 5 ^ uVar8) & p->hashMask) + 0x10400;
  UVar6 = pCVar3[uVar8];
  pCVar3[uVar8] = UVar10;
  pCVar3[uVar11 + 0x400] = UVar10;
  pCVar3[uVar5] = UVar10;
  uVar5 = 1;
  uVar11 = 0;
  bVar4 = true;
  if ((uVar9 < p->cyclicBufferSize) && (cur[-(ulong)uVar9] == *cur)) {
    *distances = 2;
    distances[1] = uVar9 - 1;
    uVar11 = 2;
    bVar4 = false;
    uVar5 = 2;
  }
  if (((CVar2 == CVar1) || (uVar8 = UVar10 - CVar2, p->cyclicBufferSize <= uVar8)) ||
     (cur[-(ulong)uVar8] != *cur)) {
    if (bVar4) {
      uVar11 = 0;
LAB_001a5a4f:
      UVar10 = 3;
      if (3 < uVar5) {
        UVar10 = uVar5;
      }
      pUVar7 = Hc_GetMatchesSpec(lenLimit,UVar6,p->pos,cur,p->son,p->cyclicBufferPos,
                                 p->cyclicBufferSize,p->cutValue,distances + uVar11,UVar10);
      UVar10 = (UInt32)((ulong)((long)pUVar7 - (long)distances) >> 2);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      goto LAB_001a5a92;
    }
  }
  else {
    distances[uVar11 + 1] = uVar8 - 1;
    uVar11 = (ulong)((int)uVar11 + 2);
    uVar5 = 3;
    uVar9 = uVar8;
  }
  UVar10 = (UInt32)uVar11;
  do {
    if (cur[(ulong)uVar5 - (ulong)uVar9] != cur[uVar5]) {
      distances[UVar10 - 2] = uVar5;
      goto LAB_001a5a4f;
    }
    uVar5 = uVar5 + 1;
  } while (lenLimit != uVar5);
  distances[UVar10 - 2] = lenLimit;
  p->son[p->cyclicBufferPos] = UVar6;
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = cur + 1;
LAB_001a5a92:
  UVar6 = p->pos + 1;
  p->pos = UVar6;
  if (UVar6 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar10;
}

Assistant:

static UInt32 Hc4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      p->son[p->cyclicBufferPos] = curMatch;
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  offset = (UInt32)(Hc_GetMatchesSpec(lenLimit, curMatch, MF_PARAMS(p),
                                      distances + offset, maxLen) -
                    (distances));
  MOVE_POS_RET
}